

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O3

void __thiscall IRBuilder::~IRBuilder(IRBuilder *this)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  Opnd **ppOVar6;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetLoopCount(pJVar4);
  ppOVar6 = this->m_saveLoopImplicitCallFlags;
  if (ppOVar6 == (Opnd **)0x0 && uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.h"
                       ,0x69,
                       "(m_func->GetJITFunctionBody()->GetLoopCount() == 0 || m_saveLoopImplicitCallFlags)"
                       ,
                       "m_func->GetJITFunctionBody()->GetLoopCount() == 0 || m_saveLoopImplicitCallFlags"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    ppOVar6 = this->m_saveLoopImplicitCallFlags;
  }
  if (ppOVar6 != (Opnd **)0x0) {
    allocator = this->m_func->m_alloc;
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar3 = JITTimeFunctionBody::GetLoopCount(pJVar4);
    Memory::DeleteArray<Memory::ArenaAllocator,IR::Opnd*>
              (&allocator->super_ArenaAllocator,(ulong)uVar3,this->m_saveLoopImplicitCallFlags);
  }
  return;
}

Assistant:

~IRBuilder()
    {
        Assert(m_func->GetJITFunctionBody()->GetLoopCount() == 0 || m_saveLoopImplicitCallFlags);
        if (m_saveLoopImplicitCallFlags)
        {
            AdeleteArray(m_func->m_alloc, m_func->GetJITFunctionBody()->GetLoopCount(), m_saveLoopImplicitCallFlags);
        }
    }